

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng_get_color_profile
               (LodePNGColorProfile *profile,uchar *in,uint w,uint h,LodePNGColorMode *mode)

{
  undefined2 uVar1;
  LodePNGColorType LVar2;
  undefined2 uVar3;
  byte g_00;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  byte bVar10;
  uint uVar11;
  uint uVar12;
  byte bVar13;
  undefined8 in_R11;
  undefined7 uVar14;
  size_t sVar15;
  bool bVar16;
  bool bVar17;
  unsigned_short b;
  unsigned_short g;
  unsigned_short r;
  unsigned_short a;
  byte local_fd;
  byte local_fc;
  byte local_fb;
  byte local_fa;
  byte local_f9;
  uint local_f8;
  uint local_f4;
  uint local_f0;
  uint local_ec;
  uchar *local_e8;
  uint local_e0;
  uint local_dc;
  uint local_d8;
  uint local_d4;
  ulong local_d0;
  LodePNGColorMode *local_c8;
  size_t local_c0;
  ColorTree tree;
  
  uVar8 = (ulong)(w * h);
  LVar2 = mode->colortype;
  local_e8 = in;
  uVar5 = lodepng_can_have_alpha(mode);
  local_f0 = lodepng_get_bpp(mode);
  local_fd = local_f0 == 1;
  local_f4 = 2;
  if (8 < local_f0) {
    local_f4 = 0x101;
  }
  if (8 >= local_f0 && !(bool)local_fd) {
    if (local_f0 == 2) {
      local_f4 = 4;
    }
    else {
      local_f4 = 0x100;
      if (local_f0 == 4) {
        local_f4 = 0x10;
      }
    }
  }
  uVar9 = (uint)((LVar2 & ~LCT_GREY_ALPHA) == LCT_GREY);
  uVar5 = uVar5 ^ 1;
  color_tree_init(&tree);
  if (mode->bitdepth == 0x10) {
    sVar15 = 0;
    do {
      if (uVar8 == sVar15) goto LAB_001ad85c;
      getPixelColorRGBA16(&r,&g,&b,&a,local_e8,sVar15,mode);
    } while (((((r & 0xff) == r >> 8) && ((g & 0xff) == g >> 8)) && ((b & 0xff) == b >> 8)) &&
            (sVar15 = sVar15 + 1, (a & 0xff) == a >> 8));
    r = 0;
    g = 0;
    b = 0;
    a = 0;
    profile->bits = 0x10;
    for (sVar15 = 0; uVar8 != sVar15; sVar15 = sVar15 + 1) {
      getPixelColorRGBA16(&r,&g,&b,&a,local_e8,sVar15,mode);
      if (uVar9 == 0) {
        if (r != g) {
LAB_001ad79d:
          profile->colored = 1;
          goto LAB_001ad7a6;
        }
        bVar17 = false;
        uVar9 = 0;
        if (r != b) goto LAB_001ad79d;
      }
      else {
LAB_001ad7a6:
        bVar17 = true;
        uVar9 = 1;
      }
      if (uVar5 == 0) {
        if ((r == profile->key_r) && (g == profile->key_g)) {
          bVar16 = b == profile->key_b;
        }
        else {
          bVar16 = false;
        }
        if (a == 0xffff) {
          uVar5 = 0;
          if ((bool)(profile->key != 0 & bVar16)) goto LAB_001ad83d;
        }
        else {
          if ((a != 0) || (!(bool)(profile->key == 0 | bVar16))) {
LAB_001ad83d:
            profile->alpha = 1;
            goto LAB_001ad845;
          }
          uVar5 = 0;
          if (profile->key == 0 && profile->alpha == 0) {
            profile->key = 1;
            profile->key_r = r;
            profile->key_g = g;
            profile->key_b = b;
          }
        }
      }
      else {
LAB_001ad845:
        uVar5 = 1;
        if (bVar17) break;
      }
    }
  }
  else {
LAB_001ad85c:
    uVar6 = 0;
    sVar15 = 0;
    local_d0 = uVar8;
    local_c8 = mode;
    do {
      uVar11 = local_f0;
      if (local_d0 == sVar15) break;
      r = r & 0xff00;
      g = g & 0xff00;
      b = b & 0xff00;
      a = a & 0xff00;
      local_f8 = uVar6;
      local_c0 = sVar15;
      getPixelColorRGBA8((uchar *)&r,(uchar *)&g,(uchar *)&b,(uchar *)&a,local_e8,sVar15,local_c8);
      uVar12 = profile->bits;
      if ((local_fd & 1) == 0 && uVar12 < 8) {
        uVar6 = 1;
        if ((1 < (byte)((byte)r + 1)) && (uVar6 = 8, (byte)r % 0x11 == 0)) {
          uVar6 = (uint)((byte)r % 0x55 != 0) * 2 + 2;
        }
        if (uVar12 < uVar6) {
          profile->bits = uVar6;
          uVar12 = uVar6;
        }
      }
      local_fd = uVar11 <= uVar12;
      uVar8 = CONCAT71((int7)((ulong)in_R11 >> 8),1);
      uVar11 = 1;
      g_00 = (byte)g;
      bVar13 = (byte)b;
      local_d4 = uVar11;
      uVar6 = uVar12;
      if (uVar9 == 0) {
        if ((byte)r == (byte)g) {
          uVar8 = 0;
          local_d4 = 0;
          if ((byte)r == (byte)b) goto LAB_001ad97f;
        }
        profile->colored = 1;
        uVar14 = (undefined7)(uVar8 >> 8);
        uVar8 = CONCAT71(uVar14,1);
        local_d4 = uVar11;
        if (uVar12 < 8) {
          profile->bits = 8;
          uVar6 = 8;
          uVar8 = CONCAT71(uVar14,1);
        }
      }
LAB_001ad97f:
      bVar4 = (byte)a;
      if (uVar5 == 0) {
        if ((profile->key_r == (r & 0xff)) && (profile->key_g == (g & 0xff))) {
          bVar17 = profile->key_b == (b & 0xff);
        }
        else {
          bVar17 = false;
        }
        if ((byte)a == 0xff) {
          bVar10 = 0;
          local_d8 = 0;
          if ((bool)(profile->key != 0 & bVar17)) {
            profile->alpha = 1;
            goto joined_r0x001adb77;
          }
        }
        else {
          if (((byte)a != 0) || (!(bool)(profile->key == 0 | bVar17))) {
            profile->alpha = 1;
joined_r0x001adb77:
            if (uVar6 < 8) {
              profile->bits = 8;
            }
            goto LAB_001ad98b;
          }
          bVar10 = 0;
          local_d8 = 0;
          if (profile->key == 0 && profile->alpha == 0) {
            profile->key = 1;
            profile->key_r = r & 0xff;
            profile->key_g = g & 0xff;
            profile->key_b = b & 0xff;
            bVar10 = 0;
            local_d8 = 0;
          }
        }
      }
      else {
LAB_001ad98b:
        bVar10 = 1;
        local_d8 = uVar11;
      }
      uVar6 = 1;
      if (local_f8 == 0) {
        local_fa = (byte)r;
        local_f9 = (byte)g;
        local_dc = (uint)(byte)r;
        local_e0 = (uint)(byte)a;
        local_ec = (uint)uVar8;
        local_f8 = uVar12;
        iVar7 = color_tree_get(&tree,(byte)r,(byte)g,(byte)b,(byte)a);
        uVar8 = (ulong)local_ec;
        uVar6 = 0;
        uVar12 = local_f8;
        if (iVar7 < 0) {
          local_fc = bVar4;
          local_fb = bVar13;
          color_tree_add(&tree,(uchar)local_dc,g_00,bVar13,(uchar)local_e0,profile->numcolors);
          uVar5 = profile->numcolors;
          if ((ulong)uVar5 < 0x100) {
            uVar8 = (ulong)(uVar5 * 4);
            profile->palette[(ulong)uVar5 * 4] = local_fa;
            profile->palette[uVar8 + 1] = local_f9;
            profile->palette[uVar8 + 2] = local_fb;
            profile->palette[uVar8 + 3] = local_fc;
          }
          profile->numcolors = uVar5 + 1;
          uVar6 = (uint)(local_f4 <= uVar5 + 1);
          uVar8 = (ulong)local_ec;
          uVar12 = local_f8;
        }
      }
      bVar13 = (byte)uVar8 & bVar10 & (byte)uVar6;
      in_R11 = CONCAT71((int7)(uVar8 >> 8),bVar13);
      sVar15 = local_c0 + 1;
      uVar5 = local_d8;
      uVar9 = local_d4;
    } while ((bVar13 != 1) || (uVar12 < local_f0));
    uVar1 = profile->key_r;
    uVar3 = profile->key_g;
    profile->key_r = uVar1 * 0x101;
    profile->key_g = uVar3 * 0x101;
    profile->key_b = (short)*(undefined4 *)&profile->key_b * 0x101;
  }
  color_tree_cleanup(&tree);
  return 0;
}

Assistant:

unsigned lodepng_get_color_profile(LodePNGColorProfile* profile,
                                   const unsigned char* in, unsigned w, unsigned h,
                                   const LodePNGColorMode* mode)
{
  unsigned error = 0;
  size_t i;
  ColorTree tree;
  size_t numpixels = w * h;

  unsigned colored_done = lodepng_is_greyscale_type(mode) ? 1 : 0;
  unsigned alpha_done = lodepng_can_have_alpha(mode) ? 0 : 1;
  unsigned numcolors_done = 0;
  unsigned bpp = lodepng_get_bpp(mode);
  unsigned bits_done = bpp == 1 ? 1 : 0;
  unsigned maxnumcolors = 257;
  unsigned sixteen = 0;
  if(bpp <= 8) maxnumcolors = bpp == 1 ? 2 : (bpp == 2 ? 4 : (bpp == 4 ? 16 : 256));

  color_tree_init(&tree);

  /*Check if the 16-bit input is truly 16-bit*/
  if(mode->bitdepth == 16)
  {
    unsigned short r, g, b, a;
    for(i = 0; i != numpixels; ++i)
    {
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode);
      if((r & 255) != ((r >> 8) & 255) || (g & 255) != ((g >> 8) & 255) ||
         (b & 255) != ((b >> 8) & 255) || (a & 255) != ((a >> 8) & 255)) /*first and second byte differ*/
      {
        sixteen = 1;
        break;
      }
    }
  }

  if(sixteen)
  {
    unsigned short r = 0, g = 0, b = 0, a = 0;
    profile->bits = 16;
    bits_done = numcolors_done = 1; /*counting colors no longer useful, palette doesn't support 16-bit*/

    for(i = 0; i != numpixels; ++i)
    {
      getPixelColorRGBA16(&r, &g, &b, &a, in, i, mode);

      if(!colored_done && (r != g || r != b))
      {
        profile->colored = 1;
        colored_done = 1;
      }

      if(!alpha_done)
      {
        unsigned matchkey = (r == profile->key_r && g == profile->key_g && b == profile->key_b);
        if(a != 65535 && (a != 0 || (profile->key && !matchkey)))
        {
          profile->alpha = 1;
          alpha_done = 1;
          if(profile->bits < 8) profile->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
        else if(a == 0 && !profile->alpha && !profile->key)
        {
          profile->key = 1;
          profile->key_r = r;
          profile->key_g = g;
          profile->key_b = b;
        }
        else if(a == 65535 && profile->key && matchkey)
        {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          profile->alpha = 1;
          alpha_done = 1;
        }
      }

      if(alpha_done && numcolors_done && colored_done && bits_done) break;
    }
  }
  else /* < 16-bit */
  {
    for(i = 0; i != numpixels; ++i)
    {
      unsigned char r = 0, g = 0, b = 0, a = 0;
      getPixelColorRGBA8(&r, &g, &b, &a, in, i, mode);

      if(!bits_done && profile->bits < 8)
      {
        /*only r is checked, < 8 bits is only relevant for greyscale*/
        unsigned bits = getValueRequiredBits(r);
        if(bits > profile->bits) profile->bits = bits;
      }
      bits_done = (profile->bits >= bpp);

      if(!colored_done && (r != g || r != b))
      {
        profile->colored = 1;
        colored_done = 1;
        if(profile->bits < 8) profile->bits = 8; /*PNG has no colored modes with less than 8-bit per channel*/
      }

      if(!alpha_done)
      {
        unsigned matchkey = (r == profile->key_r && g == profile->key_g && b == profile->key_b);
        if(a != 255 && (a != 0 || (profile->key && !matchkey)))
        {
          profile->alpha = 1;
          alpha_done = 1;
          if(profile->bits < 8) profile->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
        else if(a == 0 && !profile->alpha && !profile->key)
        {
          profile->key = 1;
          profile->key_r = r;
          profile->key_g = g;
          profile->key_b = b;
        }
        else if(a == 255 && profile->key && matchkey)
        {
          /* Color key cannot be used if an opaque pixel also has that RGB color. */
          profile->alpha = 1;
          alpha_done = 1;
          if(profile->bits < 8) profile->bits = 8; /*PNG has no alphachannel modes with less than 8-bit per channel*/
        }
      }

      if(!numcolors_done)
      {
        if(!color_tree_has(&tree, r, g, b, a))
        {
          color_tree_add(&tree, r, g, b, a, profile->numcolors);
          if(profile->numcolors < 256)
          {
            unsigned char* p = profile->palette;
            unsigned n = profile->numcolors;
            p[n * 4 + 0] = r;
            p[n * 4 + 1] = g;
            p[n * 4 + 2] = b;
            p[n * 4 + 3] = a;
          }
          ++profile->numcolors;
          numcolors_done = profile->numcolors >= maxnumcolors;
        }
      }

      if(alpha_done && numcolors_done && colored_done && bits_done) break;
    }

    /*make the profile's key always 16-bit for consistency - repeat each byte twice*/
    profile->key_r += (profile->key_r << 8);
    profile->key_g += (profile->key_g << 8);
    profile->key_b += (profile->key_b << 8);
  }

  color_tree_cleanup(&tree);
  return error;
}